

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

list * list_create(void)

{
  list *list;
  
  list = (list *)malloc(0x18);
  if (list == (list *)0x0) {
    list = (list *)0x0;
  }
  else {
    list->head = (node *)0x0;
    list->tail = (node *)0x0;
    list->size = 0;
  }
  return list;
}

Assistant:

struct list *list_create(void)
{
        struct list *list = malloc(sizeof(struct list));

        if (list == NULL) {
                return NULL;
        }

        list->head = NULL;
        list->tail = NULL;
        list->size = 0;

        return list;
}